

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O3

bool __thiscall Json::Reader::decodeNumber(Reader *this,Token *token,Value *decoded)

{
  byte bVar1;
  byte bVar2;
  byte *pbVar3;
  byte *pbVar4;
  ValueHolder VVar5;
  ValueHolder VVar6;
  bool bVar7;
  long lVar8;
  bool bVar9;
  ushort uVar10;
  long lVar11;
  ulong uVar12;
  long *plVar13;
  long *plVar14;
  size_type *psVar15;
  ushort uVar16;
  ulong uVar17;
  ulong uVar18;
  ValueHolder *this_00;
  uint uVar19;
  byte *pbVar20;
  long *local_108;
  long local_100;
  long local_f8;
  long lStack_f0;
  string local_e8;
  undefined1 *local_c8 [2];
  undefined1 local_b8 [16];
  ValueHolder local_a8 [2];
  undefined8 local_98;
  ValueHolder local_80 [5];
  ValueHolder local_58 [5];
  
  pbVar3 = (byte *)token->start_;
  pbVar4 = (byte *)token->end_;
  if (pbVar3 != pbVar4) {
    lVar11 = 0;
    bVar9 = false;
    do {
      bVar7 = !bVar9;
      bVar9 = true;
      if (bVar7) {
        uVar19 = pbVar3[lVar11] - 0x2b;
        if (uVar19 < 0x3b) {
          if ((0x400000004000009U >> ((ulong)uVar19 & 0x3f) & 1) == 0) {
            if ((ulong)uVar19 != 2) goto LAB_0010df8a;
            bVar9 = lVar11 != 0;
          }
        }
        else {
LAB_0010df8a:
          bVar9 = false;
        }
      }
      lVar8 = lVar11 + 1;
      lVar11 = lVar11 + 1;
    } while (pbVar3 + lVar8 != pbVar4);
    if (bVar9) {
LAB_0010df93:
      bVar9 = decodeDouble(this,token,decoded);
      return bVar9;
    }
  }
  bVar1 = *pbVar3;
  uVar18 = -(ulong)(bVar1 != 0x2d) | 0x8000000000000000;
  pbVar20 = pbVar3 + (bVar1 == 0x2d);
  if (pbVar20 < pbVar4) {
    uVar17 = uVar18 / 10;
    uVar12 = 0;
    do {
      bVar2 = *pbVar20;
      if ((byte)(bVar2 - 0x3a) < 0xf6) {
        local_c8[0] = local_b8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,pbVar3,pbVar4);
        plVar13 = (long *)std::__cxx11::string::replace((ulong)local_c8,0,(char *)0x0,0x119568);
        plVar14 = plVar13 + 2;
        if ((long *)*plVar13 == plVar14) {
          local_f8 = *plVar14;
          lStack_f0 = plVar13[3];
          local_108 = &local_f8;
        }
        else {
          local_f8 = *plVar14;
          local_108 = (long *)*plVar13;
        }
        local_100 = plVar13[1];
        *plVar13 = (long)plVar14;
        plVar13[1] = 0;
        *(undefined1 *)(plVar13 + 2) = 0;
        plVar13 = (long *)std::__cxx11::string::append((char *)&local_108);
        psVar15 = (size_type *)(plVar13 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar13 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar15) {
          local_e8.field_2._M_allocated_capacity = *psVar15;
          local_e8.field_2._8_8_ = plVar13[3];
          local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
        }
        else {
          local_e8.field_2._M_allocated_capacity = *psVar15;
          local_e8._M_dataplus._M_p = (pointer)*plVar13;
        }
        local_e8._M_string_length = plVar13[1];
        *plVar13 = (long)psVar15;
        plVar13[1] = 0;
        *(undefined1 *)(plVar13 + 2) = 0;
        addError(this,&local_e8,token,(Location)0x0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p);
        }
        if (local_108 != &local_f8) {
          operator_delete(local_108);
        }
        if (local_c8[0] != local_b8) {
          operator_delete(local_c8[0]);
        }
        return false;
      }
      pbVar20 = pbVar20 + 1;
      uVar19 = bVar2 - 0x30;
      if ((uVar17 <= uVar12) &&
         (((uVar17 < uVar12 || (pbVar20 != pbVar4)) || (uVar18 % 10 < (ulong)uVar19))))
      goto LAB_0010df93;
      uVar12 = (ulong)uVar19 + uVar12 * 10;
    } while (pbVar20 < pbVar4);
    if (bVar1 != 0x2d) {
      if (0x7fffffff < uVar12) {
        this_00 = local_a8;
        local_98 = 0;
        uVar16 = *(ushort *)&decoded->field_0x8;
        local_a8[0] = decoded->value_;
        (decoded->value_).uint_ = uVar12;
        uVar10 = uVar16 & 0xfe00 | 2;
        goto LAB_0010e0b5;
      }
      goto LAB_0010e08f;
    }
LAB_0010e082:
    uVar12 = -uVar12;
    this_00 = local_58;
  }
  else {
    uVar12 = 0;
    if (bVar1 == 0x2d) goto LAB_0010e082;
LAB_0010e08f:
    this_00 = local_80;
  }
  this_00[2].int_ = 0;
  uVar16 = *(ushort *)&decoded->field_0x8;
  VVar5 = decoded->value_;
  (decoded->value_).uint_ = uVar12;
  *this_00 = VVar5;
  uVar10 = (uVar16 & 0xfe00) + 1;
LAB_0010e0b5:
  *(ushort *)&decoded->field_0x8 = uVar10;
  *(ushort *)(this_00 + 1) = uVar16 & 0x1ff;
  VVar5 = (ValueHolder)decoded->start_;
  VVar6 = (ValueHolder)decoded->limit_;
  decoded->start_ = 0;
  decoded->limit_ = 0;
  this_00[3] = VVar5;
  this_00[4] = VVar6;
  Value::~Value((Value *)this_00);
  return true;
}

Assistant:

bool Reader::decodeNumber(Token& token, Value& decoded) {
  bool isDouble = false;
  for (Location inspect = token.start_; inspect != token.end_; ++inspect) {
    isDouble = isDouble || in(*inspect, '.', 'e', 'E', '+') ||
               (*inspect == '-' && inspect != token.start_);
  }
  if (isDouble)
    return decodeDouble(token, decoded);
  // Attempts to parse the number as an integer. If the number is
  // larger than the maximum supported value of an integer then
  // we decode the number as a double.
  Location current = token.start_;
  bool isNegative = *current == '-';
  if (isNegative)
    ++current;
  Value::LargestUInt maxIntegerValue =
      isNegative ? Value::LargestUInt(-Value::minLargestInt)
                 : Value::maxLargestUInt;
  Value::LargestUInt threshold = maxIntegerValue / 10;
  Value::LargestUInt value = 0;
  while (current < token.end_) {
    Char c = *current++;
    if (c < '0' || c > '9')
      return addError("'" + std::string(token.start_, token.end_) +
                          "' is not a number.",
                      token);
    Value::UInt digit(c - '0');
    if (value >= threshold) {
      // We've hit or exceeded the max value divided by 10 (rounded down). If
      // a) we've only just touched the limit, b) this is the last digit, and
      // c) it's small enough to fit in that rounding delta, we're okay.
      // Otherwise treat this number as a double to avoid overflow.
      if (value > threshold || current != token.end_ ||
          digit > maxIntegerValue % 10) {
        return decodeDouble(token, decoded);
      }
    }
    value = value * 10 + digit;
  }
  if (isNegative)
    decoded = -Value::LargestInt(value);
  else if (value <= Value::LargestUInt(Value::maxInt))
    decoded = Value::LargestInt(value);
  else
    decoded = value;
  return true;
}